

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::BuildNodeHierarchy
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes,
          vector<int,_std::allocator<int>_> *elementTokenIndexes,
          vector<int,_std::allocator<int>_> *jumps,vector<bool,_std::allocator<bool>_> *visit_table,
          size_t _curIndex,int64_t _parentNodeIndex)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  const_reference pvVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  int64_t iVar10;
  const_reference pvVar11;
  ulong uVar12;
  reference pvVar13;
  size_t *psVar14;
  bool local_2839;
  string local_2798;
  ostringstream local_2778 [8];
  ostringstream ss_e_20;
  ulong local_2600;
  value_type local_25f8;
  value_type local_25f0;
  string local_25e8;
  ostringstream local_25c8 [8];
  ostringstream ss_e_19;
  ulong local_2450;
  size_t subtreeEndIdx;
  bool has_sibling;
  ulong uStack_2440;
  bool has_child;
  size_t subtreeIdx;
  size_t subtreeStartIdx;
  ostringstream local_2410 [8];
  ostringstream ss_e_18;
  size_t siblingIndex;
  undefined1 local_2288 [6];
  bool hasSibling;
  bool hasChild;
  ostringstream local_2268 [8];
  ostringstream ss_e_17;
  string local_20f0;
  ostringstream local_20d0 [8];
  ostringstream ss_e_16;
  string local_1f58;
  ostringstream local_1f38 [8];
  ostringstream ss_e_15;
  size_t parentPathIdx;
  ostringstream local_1d98 [8];
  ostringstream ss_e_14;
  size_t parentNodeIdx;
  string name;
  ostringstream local_1bd8 [8];
  ostringstream ss_e_13;
  reference local_1a60;
  undefined1 local_1a50 [8];
  Node node;
  ostringstream local_1838 [8];
  ostringstream ss_e_12;
  string local_16c0;
  ostringstream local_16a0 [8];
  ostringstream ss_e_11;
  reference local_1528;
  string local_1518;
  ostringstream local_14f8 [8];
  ostringstream ss_e_10;
  string local_1380;
  ostringstream local_1360 [8];
  ostringstream ss_e_9;
  string local_11e8;
  ostringstream local_11c8 [8];
  ostringstream ss_e_8;
  size_t pathIdx_1;
  ostringstream local_1028 [8];
  ostringstream ss_e_7;
  string local_eb0;
  ostringstream local_e90 [8];
  ostringstream ss_e_6;
  reference local_d18;
  Node local_d08;
  string local_b10;
  ostringstream local_af0 [8];
  ostringstream ss_e_5;
  reference local_978;
  string local_968;
  ostringstream local_948 [8];
  ostringstream ss_e_4;
  string local_7d0;
  ostringstream local_7b0 [8];
  ostringstream ss_e_3;
  string local_638;
  ostringstream local_618 [8];
  ostringstream ss_e_2;
  size_t pathIdx;
  ostringstream local_478 [8];
  ostringstream ss_e_1;
  string local_2f8;
  ostringstream local_2d8 [8];
  ostringstream ss_e;
  ulong local_160;
  size_t thisIndex;
  int64_t parentNodeIndex;
  size_t endIndex;
  size_t startIndex;
  size_t maxIter;
  size_t nIter;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<long,_std::deque<long,_std::allocator<long>_>_> parentNodeIndexStack;
  size_t _curIndex_local;
  vector<bool,_std::allocator<bool>_> *visit_table_local;
  vector<int,_std::allocator<int>_> *jumps_local;
  vector<int,_std::allocator<int>_> *elementTokenIndexes_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes_local;
  CrateReader *this_local;
  
  ::std::stack<long,std::deque<long,std::allocator<long>>>::
  stack<std::deque<long,std::allocator<long>>,void>
            ((stack<long,std::deque<long,std::allocator<long>>> *)
             &startIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
             &endIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)&nIter)
  ;
  maxIter = 0;
  startIndex = (this->_config).maxPathIndicesDecodeIteration;
  endIndex = _curIndex;
  sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pathIndexes);
  parentNodeIndex = sVar4 - 1;
  thisIndex = _parentNodeIndex;
  for (; maxIter < startIndex; maxIter = maxIter + 1) {
    for (local_160 = endIndex; sVar2 = thisIndex, local_160 < parentNodeIndex + 1U;
        local_160 = local_160 + 1) {
      if (thisIndex == 0xffffffffffffffff) {
        if (local_160 != 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_2d8);
          poVar5 = ::std::operator<<((ostream *)local_2d8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x12eb);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_2d8,"TODO: Multiple root nodes.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_2f8);
          ::std::__cxx11::string::~string((string *)&local_2f8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_2d8);
          goto LAB_00237407;
        }
        sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pathIndexes);
        if (sVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_478);
          poVar5 = ::std::operator<<((ostream *)local_478,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x12ef);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_478,"Index out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&pathIdx);
          ::std::__cxx11::string::~string((string *)&pathIdx);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_478);
          goto LAB_00237407;
        }
        pvVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pathIndexes,0);
        uVar7 = (ulong)*pvVar6;
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths)
        ;
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_618);
          poVar5 = ::std::operator<<((ostream *)local_618,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x12f4);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_618,"PathIndex out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_638);
          ::std::__cxx11::string::~string((string *)&local_638);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_618);
          goto LAB_00237407;
        }
        sVar4 = ::std::
                vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                ::size(&this->_nodes);
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_7b0);
          poVar5 = ::std::operator<<((ostream *)local_7b0,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x12f8);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_7b0,"PathIndex out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_7d0);
          ::std::__cxx11::string::~string((string *)&local_7d0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_7b0);
          goto LAB_00237407;
        }
        sVar4 = ::std::vector<bool,_std::allocator<bool>_>::size(visit_table);
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_948);
          poVar5 = ::std::operator<<((ostream *)local_948,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x12fd);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_948,"[InternalError] out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_968);
          ::std::__cxx11::string::~string((string *)&local_968);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_948);
          goto LAB_00237407;
        }
        local_978 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar7);
        bVar3 = ::std::_Bit_reference::operator_cast_to_bool(&local_978);
        sVar2 = thisIndex;
        if (bVar3) {
          ::std::__cxx11::ostringstream::ostringstream(local_af0);
          poVar5 = ::std::operator<<((ostream *)local_af0,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1301);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_af0,
                                     "Circular referencing detected. Invalid Prim tree representation."
                                    );
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_b10);
          ::std::__cxx11::string::~string((string *)&local_b10);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_af0);
          goto LAB_00237407;
        }
        pvVar8 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                           (&this->_paths,uVar7);
        Node::Node(&local_d08,sVar2,pvVar8);
        pvVar9 = ::std::
                 vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 ::operator[](&this->_nodes,uVar7);
        Node::operator=(pvVar9,&local_d08);
        Node::~Node(&local_d08);
        local_d18 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar7);
        ::std::_Bit_reference::operator=(&local_d18,true);
        thisIndex = local_160;
      }
      else {
        sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pathIndexes);
        if ((long)sVar4 <= (long)sVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_e90);
          poVar5 = ::std::operator<<((ostream *)local_e90,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x130f);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_e90,"Parent Index out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_eb0);
          ::std::__cxx11::string::~string((string *)&local_eb0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_e90);
          goto LAB_00237407;
        }
        sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pathIndexes);
        if (sVar4 <= local_160) {
          ::std::__cxx11::ostringstream::ostringstream(local_1028);
          poVar5 = ::std::operator<<((ostream *)local_1028,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1313);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_1028,"Index out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&pathIdx_1);
          ::std::__cxx11::string::~string((string *)&pathIdx_1);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1028);
          goto LAB_00237407;
        }
        pvVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pathIndexes,local_160);
        uVar7 = (ulong)*pvVar6;
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths)
        ;
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_11c8);
          poVar5 = ::std::operator<<((ostream *)local_11c8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x131b);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_11c8,"PathIndex out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_11e8);
          ::std::__cxx11::string::~string((string *)&local_11e8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_11c8);
          goto LAB_00237407;
        }
        sVar4 = ::std::
                vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                ::size(&this->_nodes);
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_1360);
          poVar5 = ::std::operator<<((ostream *)local_1360,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x131f);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_1360,"PathIndex out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_1380);
          ::std::__cxx11::string::~string((string *)&local_1380);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1360);
          goto LAB_00237407;
        }
        sVar4 = ::std::vector<bool,_std::allocator<bool>_>::size(visit_table);
        if (sVar4 <= uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_14f8);
          poVar5 = ::std::operator<<((ostream *)local_14f8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1324);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_14f8,"[InternalError] out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_1518);
          ::std::__cxx11::string::~string((string *)&local_1518);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_14f8);
          goto LAB_00237407;
        }
        local_1528 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar7);
        bVar3 = ::std::_Bit_reference::operator_cast_to_bool(&local_1528);
        if (bVar3) {
          ::std::__cxx11::ostringstream::ostringstream(local_16a0);
          poVar5 = ::std::operator<<((ostream *)local_16a0,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1328);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_16a0,
                                     "Circular referencing detected. Invalid Prim tree representation."
                                    );
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_16c0);
          ::std::__cxx11::string::~string((string *)&local_16c0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_16a0);
          goto LAB_00237407;
        }
        pvVar9 = ::std::
                 vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 ::operator[](&this->_nodes,uVar7);
        iVar10 = Node::GetParent(pvVar9);
        sVar2 = thisIndex;
        if (iVar10 != -2) {
          ::std::__cxx11::ostringstream::ostringstream(local_1838);
          poVar5 = ::std::operator<<((ostream *)local_1838,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x132e);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_1838,"???: Maybe corrupted path hierarchy?.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&node._elemPath._valid);
          ::std::__cxx11::string::~string((string *)&node._elemPath._valid);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1838);
          goto LAB_00237407;
        }
        pvVar8 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                           (&this->_paths,uVar7);
        Node::Node((Node *)local_1a50,sVar2,pvVar8);
        pvVar9 = ::std::
                 vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 ::operator[](&this->_nodes,uVar7);
        Node::operator=(pvVar9,(Node *)local_1a50);
        local_1a60 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar7);
        ::std::_Bit_reference::operator=(&local_1a60,true);
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &this->_elemPaths);
        if (uVar7 < sVar4) {
          pvVar8 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                             (&this->_elemPaths,uVar7);
          Path::full_path_name_abi_cxx11_((string *)&parentNodeIdx,pvVar8);
          sVar2 = thisIndex;
          sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pathIndexes);
          if (sVar2 < sVar4) {
            pvVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pathIndexes,sVar2);
            uVar1 = *pvVar6;
            sVar4 = ::std::
                    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                    ::size(&this->_nodes);
            if (uVar1 < sVar4) {
              pvVar9 = ::std::
                       vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                       ::operator[](&this->_nodes,(ulong)uVar1);
              bVar3 = Node::AddChildren(pvVar9,(string *)&parentNodeIdx,uVar7);
              if (bVar3) {
                bVar3 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_20d0);
                poVar5 = ::std::operator<<((ostream *)local_20d0,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,"[Crate]");
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x134a);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)local_20d0,"Invalid path index.");
                ::std::operator<<(poVar5,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_20f0);
                ::std::__cxx11::string::~string((string *)&local_20f0);
                this_local._7_1_ = 0;
                bVar3 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_20d0);
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1f38);
              poVar5 = ::std::operator<<((ostream *)local_1f38,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1345);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_1f38,"PathIndex out-of-range.");
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_1f58);
              ::std::__cxx11::string::~string((string *)&local_1f58);
              this_local._7_1_ = 0;
              bVar3 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_1f38);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1d98);
            poVar5 = ::std::operator<<((ostream *)local_1d98,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,"[Crate]");
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1340);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)local_1d98,"ParentNodeIdx out-of-range.");
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&parentPathIdx);
            ::std::__cxx11::string::~string((string *)&parentPathIdx);
            this_local._7_1_ = 0;
            bVar3 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_1d98);
          }
          ::std::__cxx11::string::~string((string *)&parentNodeIdx);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1bd8);
          poVar5 = ::std::operator<<((ostream *)local_1bd8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1337);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_1bd8,"PathIndex out-of-range.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&name.field_2 + 8));
          ::std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          bVar3 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_1bd8);
        }
        Node::~Node((Node *)local_1a50);
        if (bVar3) goto LAB_00237407;
      }
      sVar4 = ::std::vector<int,_std::allocator<int>_>::size(jumps);
      if (sVar4 <= local_160) {
        ::std::__cxx11::ostringstream::ostringstream(local_2268);
        poVar5 = ::std::operator<<((ostream *)local_2268,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,"[Crate]");
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x134f);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_2268,"Index is out-of-range");
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_2288);
        ::std::__cxx11::string::~string((string *)local_2288);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_2268);
        goto LAB_00237407;
      }
      pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,local_160);
      bVar3 = true;
      if (*pvVar11 < 1) {
        pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,local_160);
        bVar3 = *pvVar11 == -1;
      }
      pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,local_160);
      if (bVar3) {
        if (-1 < *pvVar11) {
          pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,local_160);
          uVar12 = local_160 + (long)*pvVar11;
          sVar4 = ::std::vector<int,_std::allocator<int>_>::size(jumps);
          uVar7 = uVar12;
          sVar2 = uVar12;
          if (sVar4 <= uVar12) {
            ::std::__cxx11::ostringstream::ostringstream(local_2410);
            poVar5 = ::std::operator<<((ostream *)local_2410,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x135a);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)local_2410,"jump index corrupted.");
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&subtreeStartIdx);
            ::std::__cxx11::string::~string((string *)&subtreeStartIdx);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2410);
            goto LAB_00237407;
          }
          while (subtreeIdx = sVar2, uStack_2440 = uVar7, uVar7 = uStack_2440,
                sVar4 = ::std::vector<int,_std::allocator<int>_>::size(jumps), uVar7 < sVar4) {
            pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,uStack_2440);
            local_2839 = true;
            if (*pvVar11 < 1) {
              pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,uStack_2440);
              local_2839 = *pvVar11 == -1;
            }
            subtreeEndIdx._7_1_ = local_2839;
            pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,uStack_2440);
            subtreeEndIdx._6_1_ = -1 < *pvVar11;
            if (((subtreeEndIdx._7_1_ & 1) == 0) && (!(bool)subtreeEndIdx._6_1_)) break;
            sVar2 = subtreeIdx;
            uVar7 = uStack_2440 + 1;
          }
          uVar7 = uStack_2440;
          local_2450 = uStack_2440;
          sVar4 = ::std::vector<int,_std::allocator<int>_>::size(jumps);
          if (sVar4 <= uVar7) {
            ::std::__cxx11::ostringstream::ostringstream(local_25c8);
            poVar5 = ::std::operator<<((ostream *)local_25c8,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x136f);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)local_25c8,"jump indices seems corrupted.");
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_25e8);
            ::std::__cxx11::string::~string((string *)&local_25e8);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_25c8);
            goto LAB_00237407;
          }
          if (subtreeIdx <= local_2450) {
            pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](jumps,local_160);
            if (1 < *pvVar11) {
              local_25f0 = local_160 + 1;
              ::std::
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                        ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&endIndexStack.c.
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_node,&local_25f0);
              local_25f8 = uVar12 - 1;
              ::std::
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                        ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&nIter,&local_25f8);
              local_2600 = local_160;
              ::std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push
                        ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
                         &startIndexStack.c.
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node,(value_type *)&local_2600);
            }
            ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&endIndexStack.c.
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node,&subtreeIdx);
            ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&nIter,&local_2450);
            ::std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push
                      ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
                       &startIndexStack.c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node,(value_type *)&thisIndex);
            maxIter = maxIter + 1;
            break;
          }
        }
        thisIndex = local_160;
      }
    }
    bVar3 = ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)&endIndexStack.c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
    if (bVar3) break;
    pvVar13 = ::std::
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::top
                        ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&endIndexStack.c.
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_node);
    endIndex = *pvVar13;
    ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &endIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node);
    pvVar13 = ::std::
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::top
                        ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&nIter);
    parentNodeIndex = *pvVar13;
    ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &nIter);
    psVar14 = (size_t *)
              ::std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top
                        ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
                         &startIndexStack.c.
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
    thisIndex = *psVar14;
    ::std::stack<long,_std::deque<long,_std::allocator<long>_>_>::pop
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
               &startIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  if (maxIter < startIndex) {
    this_local._7_1_ = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_2778);
    poVar5 = ::std::operator<<((ostream *)local_2778,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"BuildNodeHierarchy");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x13a3);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)local_2778,"PathIndex tree Too deep.");
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_2798);
    ::std::__cxx11::string::~string((string *)&local_2798);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_2778);
  }
LAB_00237407:
  ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &nIter);
  ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &endIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::stack<long,_std::deque<long,_std::allocator<long>_>_>::~stack
            ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
             &startIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::BuildNodeHierarchy(
    std::vector<uint32_t> const &pathIndexes,
    std::vector<int32_t> const &elementTokenIndexes,
    std::vector<int32_t> const &jumps,
    std::vector<bool> &visit_table, /* inout */
    size_t _curIndex,
    int64_t _parentNodeIndex) {

  (void)elementTokenIndexes;

  std::stack<int64_t> parentNodeIndexStack;
  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;

  size_t nIter = 0;
  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  size_t startIndex = _curIndex;
  size_t endIndex = pathIndexes.size() - 1;
  int64_t parentNodeIndex = _parentNodeIndex;

  // NOTE: Need to indirectly lookup index through pathIndexes[] when accessing
  // `_nodes`
  while (nIter < maxIter) {

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      if (parentNodeIndex == -1) {
        // root node.
        // Assume single root node in the scene.
        //assert(thisIndex == 0);
        if (thisIndex != 0) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "TODO: Multiple root nodes.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }

        _nodes[pathIdx] = Node(parentNodeIndex, _paths[pathIdx]);
        visit_table[pathIdx] = true;

        parentNodeIndex = int64_t(thisIndex);

      } else {
        //if (parentNodeIndex >= int64_t(_nodes.size())) {
        //  PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        //}

        if (parentNodeIndex >= int64_t(pathIndexes.size())) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        DCOUT("Hierarchy. parent[" << pathIndexes[size_t(parentNodeIndex)]
                                   << "].add_child = " << pathIndexes[thisIndex]);

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }


        // Ensure parent is not set yet.
        if (_nodes[pathIdx].GetParent() != -2) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "???: Maybe corrupted path hierarchy?.");
        }

        Node node(parentNodeIndex, _paths[pathIdx]);
        _nodes[pathIdx] = node;

        visit_table[pathIdx] = true;

        if (pathIdx >= _elemPaths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        //std::string name = _paths[pathIndexes[thisIndex]].local_path_name();
        std::string name = _elemPaths[pathIdx].full_path_name();
        DCOUT("childName = " << name);

        size_t parentNodeIdx = size_t(parentNodeIndex);
        if (parentNodeIdx >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "ParentNodeIdx out-of-range.");
        }

        size_t parentPathIdx = pathIndexes[parentNodeIdx];
        if (parentPathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (!_nodes[parentPathIdx].AddChildren(
            name, pathIdx)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid path index.");
        }
      }

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Index is out-of-range");
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);

      if (hasChild) {
        if (hasSibling) {
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.
                parentNodeIndexStack.push(int64_t(thisIndex));
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);
            parentNodeIndexStack.push(parentNodeIndex);

            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }
        // Have a child (may have also had a sibling). Reset parent node index
        parentNodeIndex = int64_t(thisIndex);
        DCOUT("parentNodeIndex = " << parentNodeIndex);
      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentNodeIndex = parentNodeIndexStack.top();
    parentNodeIndexStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}